

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_script.cpp
# Opt level: O2

void __thiscall Script_GetWitnessScriptHash_Test::TestBody(Script_GetWitnessScriptHash_Test *this)

{
  char *message;
  AssertHelper AStack_98;
  AssertionResult gtest_ar;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_80 [4];
  ScriptHash script_hash;
  Script script;
  
  std::__cxx11::string::string
            ((string *)&script_hash,
             "002096376230fbeec4d1e703c3a2d1efe975ccf650a40f6ca2ec2d6cce44fc6bb2b3",
             (allocator *)local_80);
  cfd::core::Script::Script(&script,(string *)&script_hash);
  std::__cxx11::string::~string((string *)&script_hash);
  cfd::core::Script::GetWitnessScriptHash();
  cfd::core::ScriptHash::GetHex_abi_cxx11_();
  testing::internal::CmpHelperSTREQ
            ((internal *)&gtest_ar,"script_hash.GetHex().c_str()",
             "\"00206bb5cc76cdbd684cb6f7c43a98c61c5aa789368d5e319e6c8258de3fec796562\"",
             (char *)local_80[0].ptr_,
             "00206bb5cc76cdbd684cb6f7c43a98c61c5aa789368d5e319e6c8258de3fec796562");
  std::__cxx11::string::~string((string *)local_80);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)local_80);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      message = "";
    }
    else {
      message = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&AStack_98,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_script.cpp"
               ,0x10a,message);
    testing::internal::AssertHelper::operator=(&AStack_98,(Message *)local_80);
    testing::internal::AssertHelper::~AssertHelper(&AStack_98);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr(local_80);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  cfd::core::ScriptHash::~ScriptHash(&script_hash);
  cfd::core::Script::~Script(&script);
  return;
}

Assistant:

TEST(Script, GetWitnessScriptHash) {
  Script script(
      "002096376230fbeec4d1e703c3a2d1efe975ccf650a40f6ca2ec2d6cce44fc6bb2b3");
  ScriptHash script_hash = script.GetWitnessScriptHash();
  EXPECT_STREQ(
      script_hash.GetHex().c_str(),
      "00206bb5cc76cdbd684cb6f7c43a98c61c5aa789368d5e319e6c8258de3fec796562");
}